

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_File_Chooser2.cxx
# Opt level: O0

void unquote_pathname(char *dst,char *src,int dstsize)

{
  int local_1c;
  char *pcStack_18;
  int dstsize_local;
  char *src_local;
  char *dst_local;
  
  pcStack_18 = src;
  src_local = dst;
  for (local_1c = dstsize + -1; *pcStack_18 != '\0' && 0 < local_1c; local_1c = local_1c + -1) {
    if (*pcStack_18 == '\\') {
      pcStack_18 = pcStack_18 + 1;
    }
    *src_local = *pcStack_18;
    pcStack_18 = pcStack_18 + 1;
    src_local = src_local + 1;
  }
  *src_local = '\0';
  return;
}

Assistant:

static void
unquote_pathname(char       *dst,	// O - Destination string
                 const char *src,	// I - Source string
	         int        dstsize)	// I - Size of destination string
{
  dstsize--; // prepare for trailing zero

  while (*src && dstsize > 0) {
    if (*src == '\\') src++;
    *dst++ = *src++;
    dstsize--;
  }

  *dst = '\0';
}